

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::parser::ChaiScript_Parser::buildInt
          (ChaiScript_Parser *this,int base,string *t_val,bool prefixed)

{
  size_type sVar1;
  pointer pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  _Alloc_hider __nptr;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  size_type sVar12;
  byte bVar13;
  Boxed_Value BVar14;
  undefined1 auVar15 [12];
  string val;
  pointer local_60;
  int local_58;
  int local_54;
  string local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  
  sVar1 = t_val->_M_string_length;
  bVar7 = false;
  bVar6 = false;
  bVar5 = false;
  bVar4 = false;
  sVar12 = sVar1;
  do {
    if (sVar12 == 0) break;
    bVar13 = (t_val->_M_dataplus)._M_p[sVar12 - 1] & 0xdf;
    if (bVar13 == 0x55) {
      bVar3 = true;
      bVar4 = true;
    }
    else if (bVar13 == 0x4c) {
      bVar6 = bVar7;
      if (bVar5) {
        bVar6 = true;
      }
      bVar3 = true;
      bVar5 = true;
      bVar7 = bVar6;
    }
    else {
      bVar3 = false;
    }
    sVar12 = sVar12 - 1;
  } while (bVar3);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_58 = base;
  if (prefixed) {
    pcVar2 = (t_val->_M_dataplus)._M_p;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((string *)&local_50,pcVar2 + 2,pcVar2 + sVar1);
  }
  else {
    pcVar2 = (t_val->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar2,pcVar2 + sVar1);
  }
  __nptr._M_p = local_50._M_dataplus._M_p;
  piVar9 = __errno_location();
  local_54 = *piVar9;
  *piVar9 = 0;
  pcVar10 = (char *)strtoll(__nptr._M_p,&local_60,local_58);
  if (local_60 == __nptr._M_p) {
    auVar15 = std::__throw_invalid_argument("stoll");
    if (auVar15._8_4_ != 1) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      _Unwind_Resume(auVar15._0_8_);
    }
    __cxa_begin_catch(auVar15._0_8_);
    local_60 = (pointer)std::__cxx11::stoull(&local_50,(size_t *)0x0,local_58);
    detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_60);
    __cxa_end_catch();
    _Var11._M_pi = extraout_RDX_00;
    goto LAB_00195875;
  }
  if (*piVar9 == 0) {
LAB_00195799:
    *piVar9 = local_54;
  }
  else if (*piVar9 == 0x22) {
    pcVar10 = (char *)std::__throw_out_of_range("stoll");
    goto LAB_00195799;
  }
  iVar8 = (int)pcVar10;
  if ((bVar4) || ((char *)(long)iVar8 != pcVar10 || bVar5)) {
    if (((local_58 != 10 | bVar4) == 0xff && !bVar5) && (ulong)pcVar10 >> 0x20 == 0) {
      local_60 = (pointer)CONCAT44(local_60._4_4_,iVar8);
      BVar14 = detail::const_var_impl<unsigned_int>((detail *)this,(uint *)&local_60);
      _Var11._M_pi = BVar14.m_data.
                     super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    else {
      local_60 = pcVar10;
      if ((bVar4) || (bVar6)) {
        if ((local_58 == 10 && !bVar4) || (bVar6)) {
          if (bVar4) {
            BVar14 = detail::const_var_impl<unsigned_long_long>
                               ((detail *)this,(unsigned_long_long *)&local_60);
            _Var11._M_pi = BVar14.m_data.
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          else {
            BVar14 = detail::const_var_impl<long_long>((detail *)this,(longlong *)&local_60);
            _Var11._M_pi = BVar14.m_data.
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
        }
        else {
          BVar14 = detail::const_var_impl<unsigned_long>((detail *)this,(unsigned_long *)&local_60);
          _Var11._M_pi = BVar14.m_data.
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
        }
      }
      else {
        BVar14 = detail::const_var_impl<long>((detail *)this,(long *)&local_60);
        _Var11._M_pi = BVar14.m_data.
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
      }
    }
  }
  else {
    local_60 = (pointer)CONCAT44(local_60._4_4_,iVar8);
    BVar14 = detail::const_var_impl<int>((detail *)this,(int *)&local_60);
    _Var11._M_pi = BVar14.m_data.
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
  }
LAB_00195875:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    _Var11._M_pi = extraout_RDX;
  }
  BVar14.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var11._M_pi;
  BVar14.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar14.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

static Boxed_Value buildInt(const int base, const std::string &t_val, const bool prefixed)
      {
        bool unsigned_ = false;
        bool long_ = false;
        bool longlong_ = false;

        auto i = t_val.size();

        for (; i > 0; --i)
        {
          const char val = t_val[i-1];

          if (val == 'u' || val == 'U')
          {
            unsigned_ = true;
          } else if (val == 'l' || val == 'L') {
            if (long_)
            {
              longlong_ = true;
            }

            long_ = true;
          } else {
            break;
          }
        }

        const auto val = prefixed?std::string(t_val.begin()+2,t_val.end()):t_val;

#ifdef __GNUC__
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-compare"

#ifdef CHAISCRIPT_CLANG
#pragma GCC diagnostic ignored "-Wtautological-compare"
#endif

#endif

        try {
          auto u = std::stoll(val,nullptr,base);


          if (!unsigned_ && !long_ && u >= std::numeric_limits<int>::min() && u <= std::numeric_limits<int>::max()) {
            return const_var(static_cast<int>(u));
          } else if ((unsigned_ || base != 10) && !long_ && u >= std::numeric_limits<unsigned int>::min() && u <= std::numeric_limits<unsigned int>::max()) {
            return const_var(static_cast<unsigned int>(u));
          } else if (!unsigned_ && !longlong_ && u >= std::numeric_limits<long>::min() && u <= std::numeric_limits<long>::max()) {
            return const_var(static_cast<long>(u));
          } else if ((unsigned_ || base != 10) && !longlong_ && u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
            return const_var(static_cast<unsigned long>(u));
          } else if (!unsigned_ && u >= std::numeric_limits<long long>::min() && u <= std::numeric_limits<long long>::max()) {
            return const_var(static_cast<long long>(u));
          } else {
            return const_var(static_cast<unsigned long long>(u));
          }

        } catch (const std::out_of_range &) {
          // too big to be signed
          try {
            auto u = std::stoull(val,nullptr,base);

            if (u >= std::numeric_limits<unsigned long>::min() && u <= std::numeric_limits<unsigned long>::max()) {
              return const_var(static_cast<unsigned long>(u));
            } else {
              return const_var(static_cast<unsigned long long>(u));
            }
          } catch (const std::out_of_range &) {
            // it's just simply too big
            return const_var(std::numeric_limits<long long>::max());
          }
        }

#ifdef __GNUC__
#pragma GCC diagnostic pop
#endif

      }